

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest20_21::deinit(FunctionalTest20_21 *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  uint local_20;
  uint local_1c;
  GLuint i_1;
  GLuint i;
  Functions *gl;
  FunctionalTest20_21 *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
    if (this->m_program_pipelines[local_1c] != 0) {
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x450))(1,this->m_program_pipelines + local_1c);
      this->m_program_pipelines[local_1c] = 0;
    }
  }
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    if (this->m_shared_contexts[local_20] != (RenderContext *)0x0) {
      if (this->m_shared_contexts[local_20] != (RenderContext *)0x0) {
        (*this->m_shared_contexts[local_20]->_vptr_RenderContext[1])();
      }
      this->m_shared_contexts[local_20] = (RenderContext *)0x0;
    }
  }
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  (*pRVar2->_vptr_RenderContext[8])();
  return;
}

Assistant:

void FunctionalTest20_21::deinit()
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (GLuint i = 0; i < m_n_shared_contexts + 1; ++i)
	{
		if (0 != m_program_pipelines[i])
		{
			gl.deleteProgramPipelines(1, &m_program_pipelines[i]);
			m_program_pipelines[i] = 0;
		}
	}

	for (GLuint i = 0; i < m_n_shared_contexts; ++i)
	{
		if (0 != m_shared_contexts[i])
		{
			delete m_shared_contexts[i];
			m_shared_contexts[i] = 0;
		}
	}

	m_context.getRenderContext().makeCurrent();
}